

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O1

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CSignalCommand>
          (CCommandBuffer *this,CSignalCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  CCommand *pCVar3;
  undefined4 uVar4;
  CCommand *pCVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar6 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar7 = (uVar1 - uVar6) + 0x20;
  if ((this->m_CmdBuffer).m_Size < uVar7) {
    pCVar5 = (CCommand *)0x0;
  }
  else {
    pCVar5 = (CCommand *)(puVar2 + (uVar1 - uVar6) + 8);
    (this->m_CmdBuffer).m_Used = (uint)uVar7;
  }
  if (pCVar5 != (CCommand *)0x0) {
    uVar4 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
    pCVar3 = (Command->super_CCommand).m_pNext;
    pCVar5->m_Cmd = (Command->super_CCommand).m_Cmd;
    *(undefined4 *)&pCVar5->field_0x4 = uVar4;
    pCVar5->m_pNext = pCVar3;
    *(semaphore **)(pCVar5 + 1) = Command->m_pSemaphore;
    pCVar5->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar5;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar5;
    }
    this->m_pCmdBufferTail = pCVar5;
  }
  return pCVar5 != (CCommand *)0x0;
}

Assistant:

void *Alloc(unsigned Requested, unsigned Alignment = 8) // TODO: use alignof(std::max_align_t)
		{
			size_t Offset = Alignment - (reinterpret_cast<uintptr_t>(m_pData + m_Used) % Alignment);
			if(Requested + Offset + m_Used > m_Size)
				return 0;

			void *pPtr = &m_pData[m_Used + Offset];
			m_Used += Requested + Offset;
			return pPtr;
		}